

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliY.hpp
# Opt level: O2

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::PauliY<std::complex<float>_>::matrix(PauliY<std::complex<float>_> *this)

{
  complex<float> in_RCX;
  complex<float> in_RDX;
  data_type extraout_RDX;
  complex<float> in_RSI;
  complex<float> in_R8;
  SquareMatrix<std::complex<float>_> SVar1;
  
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)this,in_RSI,in_RDX,in_RCX,in_R8);
  SVar1.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)this;
  return SVar1;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >(   0    , T(0,-1) ,
                                                  T(0,1) ,   0     ) ;
        }